

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::sse2::ConeCurveMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  undefined4 uVar17;
  Geometry *pGVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  long lVar24;
  RTCIntersectArguments *pRVar25;
  RTCFilterFunctionN p_Var26;
  RTCRayN *pRVar27;
  long lVar28;
  bool bVar29;
  int iVar30;
  long lVar31;
  Scene *pSVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  float fVar39;
  float fVar40;
  uint uVar41;
  float fVar48;
  float fVar50;
  float fVar52;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar49;
  uint uVar51;
  uint uVar53;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar54;
  float fVar55;
  float fVar62;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar63;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar72;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar96;
  float fVar101;
  float fVar102;
  undefined1 auVar97 [16];
  float fVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint uVar104;
  undefined1 auVar100 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  uint uVar108;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  uint uVar116;
  uint uVar120;
  uint uVar124;
  undefined1 auVar112 [16];
  float fVar125;
  float fVar126;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar148 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  Scene *local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  RTCFilterFunctionNArguments local_258;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  uint local_1c8 [4];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  uint local_148 [4];
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  undefined1 local_f8 [16];
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_300 = context->scene;
  local_2b8 = (ulong)line->sharedGeomID;
  uVar35 = (line->v0).field_0.i[0];
  pGVar18 = (local_300->geometries).items[local_2b8].ptr;
  fVar54 = pGVar18->fnumTimeSegments;
  fVar39 = (pGVar18->time_range).lower;
  fVar39 = floorf(((*(float *)(ray + k * 4 + 0x70) - fVar39) /
                  ((pGVar18->time_range).upper - fVar39)) * fVar54);
  fVar54 = fVar54 + -1.0;
  if (fVar54 <= fVar39) {
    fVar39 = fVar54;
  }
  fVar54 = 0.0;
  if (0.0 <= fVar39) {
    fVar54 = fVar39;
  }
  lVar31 = *(long *)&pGVar18[3].time_range.upper;
  lVar33 = (long)(int)fVar54 * 0x38;
  lVar24 = *(long *)(lVar31 + lVar33);
  lVar28 = *(long *)(lVar31 + 0x10 + lVar33);
  pfVar1 = (float *)(lVar24 + lVar28 * (ulong)uVar35);
  uVar36 = (line->v0).field_0.i[1];
  pfVar2 = (float *)(lVar24 + lVar28 * (ulong)uVar36);
  uVar37 = (line->v0).field_0.i[2];
  pfVar3 = (float *)(lVar24 + lVar28 * (ulong)uVar37);
  uVar38 = (line->v0).field_0.i[3];
  pfVar4 = (float *)(lVar24 + lVar28 * (ulong)uVar38);
  puVar5 = (undefined8 *)(lVar24 + lVar28 * (ulong)(uVar35 + 1));
  uVar21 = *puVar5;
  uVar22 = puVar5[1];
  pfVar6 = (float *)(lVar24 + lVar28 * (ulong)(uVar36 + 1));
  pfVar7 = (float *)(lVar24 + lVar28 * (ulong)(uVar37 + 1));
  fVar54 = pfVar7[2];
  pfVar8 = (float *)(lVar24 + lVar28 * (ulong)(uVar38 + 1));
  lVar24 = *(long *)(lVar31 + 0x38 + lVar33);
  lVar31 = *(long *)(lVar31 + 0x48 + lVar33);
  pfVar9 = (float *)(lVar24 + (ulong)uVar35 * lVar31);
  pfVar10 = (float *)(lVar24 + (ulong)uVar36 * lVar31);
  pfVar11 = (float *)(lVar24 + (ulong)uVar37 * lVar31);
  pfVar12 = (float *)(lVar24 + (ulong)uVar38 * lVar31);
  pfVar13 = (float *)(lVar24 + (ulong)(uVar35 + 1) * lVar31);
  pfVar14 = (float *)(lVar24 + (ulong)(uVar37 + 1) * lVar31);
  local_338 = (float)uVar21;
  fStack_334 = (float)((ulong)uVar21 >> 0x20);
  fStack_330 = (float)uVar22;
  fStack_32c = (float)((ulong)uVar22 >> 0x20);
  pfVar15 = (float *)(lVar24 + (ulong)(uVar36 + 1) * lVar31);
  lVar31 = lVar31 * (ulong)(uVar38 + 1);
  pfVar16 = (float *)(lVar24 + lVar31);
  fVar39 = 1.0 - fVar54;
  fVar135 = *pfVar1 * fVar39 + *pfVar9 * fVar54;
  fVar138 = *pfVar2 * fVar39 + *pfVar10 * fVar54;
  fVar140 = *pfVar3 * fVar39 + *pfVar11 * fVar54;
  fVar142 = *pfVar4 * fVar39 + *pfVar12 * fVar54;
  fVar152 = pfVar1[1] * fVar39 + pfVar9[1] * fVar54;
  fVar154 = pfVar2[1] * fVar39 + pfVar10[1] * fVar54;
  fVar156 = pfVar3[1] * fVar39 + pfVar11[1] * fVar54;
  fVar158 = pfVar4[1] * fVar39 + pfVar12[1] * fVar54;
  fVar105 = pfVar1[2] * fVar39 + pfVar9[2] * fVar54;
  fVar113 = pfVar2[2] * fVar39 + pfVar10[2] * fVar54;
  fVar117 = pfVar3[2] * fVar39 + pfVar11[2] * fVar54;
  fVar121 = pfVar4[2] * fVar39 + pfVar12[2] * fVar54;
  fVar106 = pfVar1[3] * fVar39 + pfVar9[3] * fVar54;
  fVar114 = pfVar2[3] * fVar39 + pfVar10[3] * fVar54;
  fVar118 = pfVar3[3] * fVar39 + pfVar11[3] * fVar54;
  fVar122 = pfVar4[3] * fVar39 + pfVar12[3] * fVar54;
  fVar86 = local_338 * fVar39 + *pfVar13 * fVar54;
  fVar90 = *pfVar6 * fVar39 + *pfVar15 * fVar54;
  fVar92 = *pfVar7 * fVar39 + *pfVar14 * fVar54;
  fVar94 = *pfVar8 * fVar39 + *pfVar16 * fVar54;
  fVar78 = fStack_334 * fVar39 + pfVar13[1] * fVar54;
  fVar80 = pfVar6[1] * fVar39 + pfVar15[1] * fVar54;
  fVar82 = pfVar7[1] * fVar39 + pfVar14[1] * fVar54;
  fVar84 = pfVar8[1] * fVar39 + pfVar16[1] * fVar54;
  fStack_380 = (float)_local_388;
  fStack_37c = (float)((ulong)_local_388 >> 0x20);
  fVar160 = fStack_330 * fVar39 + pfVar13[2] * fVar54;
  fVar162 = pfVar6[2] * fVar39 + pfVar15[2] * fVar54;
  fVar164 = fStack_380 * fVar39 + pfVar14[2] * fVar54;
  fVar166 = fStack_37c * fVar39 + pfVar16[2] * fVar54;
  fVar72 = fVar39 * fStack_32c + fVar54 * pfVar13[3];
  fVar75 = fVar39 * pfVar6[3] + fVar54 * pfVar15[3];
  fVar76 = fVar39 * pfVar7[3] + fVar54 * pfVar14[3];
  fVar77 = fVar39 * pfVar8[3] + fVar54 * pfVar16[3];
  local_148[0] = (uint)(float)local_2b8;
  local_148[1] = (uint)(float)local_2b8;
  local_148[2] = (uint)(float)local_2b8;
  local_148[3] = (uint)(float)local_2b8;
  fVar54 = *(float *)(ray + k * 4 + 0x40);
  fStack_2b0 = *(float *)(ray + k * 4 + 0x50);
  local_1d8 = *(float *)(ray + k * 4 + 0x60);
  auVar88._0_4_ = fVar54 * fVar54 + fStack_2b0 * fStack_2b0 + local_1d8 * local_1d8;
  auVar88._4_4_ = auVar88._0_4_;
  auVar88._8_4_ = auVar88._0_4_;
  auVar88._12_4_ = auVar88._0_4_;
  auVar97 = rcpps(ZEXT416((uint)(local_1d8 * local_1d8)),auVar88);
  fVar147 = auVar97._0_4_;
  fVar149 = auVar97._4_4_;
  fVar150 = auVar97._8_4_;
  fVar151 = auVar97._12_4_;
  fVar39 = *(float *)(ray + k * 4 + 0x10);
  fVar52 = *(float *)(ray + k * 4 + 0x20);
  fVar103 = *(float *)(ray + k * 4);
  fVar55 = (((fVar135 + fVar86) * 0.5 - fVar103) * fVar54 +
           ((fVar152 + fVar78) * 0.5 - fVar39) * fStack_2b0 +
           ((fVar105 + fVar160) * 0.5 - fVar52) * local_1d8) *
           ((1.0 - auVar88._0_4_ * fVar147) * fVar147 + fVar147);
  fVar62 = (((fVar138 + fVar90) * 0.5 - fVar103) * fVar54 +
           ((fVar154 + fVar80) * 0.5 - fVar39) * fStack_2b0 +
           ((fVar113 + fVar162) * 0.5 - fVar52) * local_1d8) *
           ((1.0 - auVar88._0_4_ * fVar149) * fVar149 + fVar149);
  fStack_2c0 = (((fVar140 + fVar92) * 0.5 - fVar103) * fVar54 +
               ((fVar156 + fVar82) * 0.5 - fVar39) * fStack_2b0 +
               ((fVar117 + fVar164) * 0.5 - fVar52) * local_1d8) *
               ((1.0 - auVar88._0_4_ * fVar150) * fVar150 + fVar150);
  fStack_2bc = (((fVar142 + fVar94) * 0.5 - fVar103) * fVar54 +
               ((fVar158 + fVar84) * 0.5 - fVar39) * fStack_2b0 +
               ((fVar121 + fVar166) * 0.5 - fVar52) * local_1d8) *
               ((1.0 - auVar88._0_4_ * fVar151) * fVar151 + fVar151);
  fVar96 = fVar54 * fVar55 + fVar103;
  fVar101 = fVar54 * fVar62 + fVar103;
  fVar102 = fVar54 * fStack_2c0 + fVar103;
  fVar103 = fVar54 * fStack_2bc + fVar103;
  fVar144 = fStack_2b0 * fVar55 + fVar39;
  fVar145 = fStack_2b0 * fVar62 + fVar39;
  fVar146 = fStack_2b0 * fStack_2c0 + fVar39;
  fVar39 = fStack_2b0 * fStack_2bc + fVar39;
  local_2c8 = (RayK<4> *)CONCAT44(fVar62,fVar55);
  fVar40 = local_1d8 * fVar55 + fVar52;
  fVar48 = local_1d8 * fVar62 + fVar52;
  fVar50 = local_1d8 * fStack_2c0 + fVar52;
  fVar52 = local_1d8 * fStack_2bc + fVar52;
  fVar147 = fVar86 - fVar135;
  fVar149 = fVar90 - fVar138;
  fVar150 = fVar92 - fVar140;
  fVar151 = fVar94 - fVar142;
  fVar135 = fVar96 - fVar135;
  fVar138 = fVar101 - fVar138;
  fVar140 = fVar102 - fVar140;
  fVar142 = fVar103 - fVar142;
  fVar125 = fVar78 - fVar152;
  fVar129 = fVar80 - fVar154;
  fVar131 = fVar82 - fVar156;
  fVar133 = fVar84 - fVar158;
  fVar152 = fVar144 - fVar152;
  fVar154 = fVar145 - fVar154;
  fVar156 = fVar146 - fVar156;
  fVar158 = fVar39 - fVar158;
  fVar79 = fVar160 - fVar105;
  fVar81 = fVar162 - fVar113;
  fVar83 = fVar164 - fVar117;
  fVar85 = fVar166 - fVar121;
  fVar105 = fVar40 - fVar105;
  fVar113 = fVar48 - fVar113;
  fVar117 = fVar50 - fVar117;
  fVar121 = fVar52 - fVar121;
  local_2d8._0_4_ = fVar147 * fVar147 + fVar125 * fVar125 + fVar79 * fVar79;
  local_2d8._4_4_ = fVar149 * fVar149 + fVar129 * fVar129 + fVar81 * fVar81;
  fStack_2d0 = fVar150 * fVar150 + fVar131 * fVar131 + fVar83 * fVar83;
  fStack_2cc = fVar151 * fVar151 + fVar133 * fVar133 + fVar85 * fVar85;
  fVar161 = fVar147 * fVar135 + fVar125 * fVar152 + fVar79 * fVar105;
  fVar163 = fVar149 * fVar138 + fVar129 * fVar154 + fVar81 * fVar113;
  fVar165 = fVar150 * fVar140 + fVar131 * fVar156 + fVar83 * fVar117;
  fVar167 = fVar151 * fVar142 + fVar133 * fVar158 + fVar85 * fVar121;
  fVar153 = fVar147 * fVar54 + fVar125 * fStack_2b0 + fVar79 * local_1d8;
  fVar155 = fVar149 * fVar54 + fVar129 * fStack_2b0 + fVar81 * local_1d8;
  fVar157 = fVar150 * fVar54 + fVar131 * fStack_2b0 + fVar83 * local_1d8;
  fVar159 = fVar151 * fVar54 + fVar133 * fStack_2b0 + fVar85 * local_1d8;
  local_2b8 = CONCAT44(fStack_2b0,fStack_2b0);
  fVar63 = fVar106 - fVar72;
  fVar69 = fVar114 - fVar75;
  fVar70 = fVar118 - fVar76;
  fVar71 = fVar122 - fVar77;
  fVar136 = fVar63 * fVar63 + (float)local_2d8._0_4_;
  fVar139 = fVar69 * fVar69 + (float)local_2d8._4_4_;
  fVar141 = fVar70 * fVar70 + fStack_2d0;
  fVar143 = fVar71 * fVar71 + fStack_2cc;
  local_158 = (float)local_2d8._0_4_ * (float)local_2d8._0_4_;
  fStack_154 = (float)local_2d8._4_4_ * (float)local_2d8._4_4_;
  fStack_150 = fStack_2d0 * fStack_2d0;
  fStack_14c = fStack_2cc * fStack_2cc;
  fVar107 = fVar153 * fVar153;
  fVar115 = fVar155 * fVar155;
  fVar119 = fVar157 * fVar157;
  fVar123 = fVar159 * fVar159;
  auVar97._0_4_ = local_158 - fVar136 * fVar107;
  auVar97._4_4_ = fStack_154 - fVar139 * fVar115;
  auVar97._8_4_ = fStack_150 - fVar141 * fVar119;
  auVar97._12_4_ = fStack_14c - fVar143 * fVar123;
  fVar87 = fVar106 * (float)local_2d8._0_4_;
  fVar91 = fVar114 * (float)local_2d8._4_4_;
  fVar93 = fVar118 * fStack_2d0;
  fVar95 = fVar122 * fStack_2cc;
  fVar168 = fVar63 * fVar153 * fVar87 +
            ((fVar54 * fVar135 + fStack_2b0 * fVar152 + local_1d8 * fVar105) * local_158 -
            fVar153 * fVar161 * fVar136);
  fVar169 = fVar69 * fVar155 * fVar91 +
            ((fVar54 * fVar138 + fStack_2b0 * fVar154 + local_1d8 * fVar113) * fStack_154 -
            fVar155 * fVar163 * fVar139);
  fVar170 = fVar70 * fVar157 * fVar93 +
            ((fVar54 * fVar140 + fStack_2b0 * fVar156 + local_1d8 * fVar117) * fStack_150 -
            fVar157 * fVar165 * fVar141);
  fVar171 = fVar71 * fVar159 * fVar95 +
            ((fVar54 * fVar142 + fStack_2b0 * fVar158 + local_1d8 * fVar121) * fStack_14c -
            fVar159 * fVar167 * fVar143);
  auVar110._0_4_ =
       fVar168 * fVar168 -
       (((fVar63 + fVar63) * fVar161 - fVar87) * fVar87 +
       ((fVar135 * fVar135 + fVar152 * fVar152 + fVar105 * fVar105) * local_158 -
       fVar161 * fVar161 * fVar136)) * auVar97._0_4_;
  auVar110._4_4_ =
       fVar169 * fVar169 -
       (((fVar69 + fVar69) * fVar163 - fVar91) * fVar91 +
       ((fVar138 * fVar138 + fVar154 * fVar154 + fVar113 * fVar113) * fStack_154 -
       fVar163 * fVar163 * fVar139)) * auVar97._4_4_;
  auVar110._8_4_ =
       fVar170 * fVar170 -
       (((fVar70 + fVar70) * fVar165 - fVar93) * fVar93 +
       ((fVar140 * fVar140 + fVar156 * fVar156 + fVar117 * fVar117) * fStack_150 -
       fVar165 * fVar165 * fVar141)) * auVar97._8_4_;
  auVar110._12_4_ =
       fVar171 * fVar171 -
       (((fVar71 + fVar71) * fVar167 - fVar95) * fVar95 +
       ((fVar142 * fVar142 + fVar158 * fVar158 + fVar121 * fVar121) * fStack_14c -
       fVar167 * fVar167 * fVar143)) * auVar97._12_4_;
  auVar56._0_4_ =
       ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) & -(uint)(0.0 <= auVar110._0_4_);
  auVar56._4_4_ =
       ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) & -(uint)(0.0 <= auVar110._4_4_);
  auVar56._8_4_ =
       ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) & -(uint)(0.0 <= auVar110._8_4_);
  auVar56._12_4_ =
       ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) & -(uint)(0.0 <= auVar110._12_4_);
  lVar24 = (ulong)line->leftExists * 0x10;
  lVar28 = (ulong)line->rightExists * 0x10;
  iVar30 = movmskps((int)lVar31,auVar56);
  if (iVar30 != 0) {
    fVar96 = fVar96 - fVar86;
    fVar101 = fVar101 - fVar90;
    fVar102 = fVar102 - fVar92;
    fVar103 = fVar103 - fVar94;
    fVar144 = fVar144 - fVar78;
    fVar145 = fVar145 - fVar80;
    fVar146 = fVar146 - fVar82;
    fVar39 = fVar39 - fVar84;
    auVar109._0_4_ = fVar125 * fVar144;
    auVar109._4_4_ = fVar129 * fVar145;
    auVar109._8_4_ = fVar131 * fVar146;
    auVar109._12_4_ = fVar133 * fVar39;
    fVar40 = fVar40 - fVar160;
    fVar48 = fVar48 - fVar162;
    fVar50 = fVar50 - fVar164;
    fVar52 = fVar52 - fVar166;
    fVar126 = fVar79 * fVar40 + auVar109._0_4_ + fVar147 * fVar96;
    fVar130 = fVar81 * fVar48 + auVar109._4_4_ + fVar149 * fVar101;
    fVar132 = fVar83 * fVar50 + auVar109._8_4_ + fVar150 * fVar102;
    fVar134 = fVar85 * fVar52 + auVar109._12_4_ + fVar151 * fVar103;
    auVar88 = sqrtps(auVar110,auVar110);
    auVar110 = rcpps(auVar109,auVar97);
    fVar78 = auVar110._0_4_;
    fVar80 = auVar110._4_4_;
    fVar82 = auVar110._8_4_;
    fVar84 = auVar110._12_4_;
    uVar35 = -(uint)(1e-18 < ABS(auVar97._0_4_));
    uVar36 = -(uint)(1e-18 < ABS(auVar97._4_4_));
    uVar37 = -(uint)(1e-18 < ABS(auVar97._8_4_));
    uVar38 = -(uint)(1e-18 < ABS(auVar97._12_4_));
    fVar78 = (1.0 - auVar97._0_4_ * fVar78) * fVar78 + fVar78;
    fVar80 = (1.0 - auVar97._4_4_ * fVar80) * fVar80 + fVar80;
    fVar82 = (1.0 - auVar97._8_4_ * fVar82) * fVar82 + fVar82;
    fVar84 = (1.0 - auVar97._12_4_ * fVar84) * fVar84 + fVar84;
    fVar86 = (float)(~uVar35 & 0xff800000 | (uint)((-fVar168 - auVar88._0_4_) * fVar78) & uVar35);
    fVar87 = (float)(~uVar36 & 0xff800000 | (uint)((-fVar169 - auVar88._4_4_) * fVar80) & uVar36);
    fVar90 = (float)(~uVar37 & 0xff800000 | (uint)((-fVar170 - auVar88._8_4_) * fVar82) & uVar37);
    fVar91 = (float)(~uVar38 & 0xff800000 | (uint)((-fVar171 - auVar88._12_4_) * fVar84) & uVar38);
    fVar78 = (float)(~uVar35 & 0x7f800000 | (uint)((auVar88._0_4_ - fVar168) * fVar78) & uVar35);
    fVar80 = (float)(~uVar36 & 0x7f800000 | (uint)((auVar88._4_4_ - fVar169) * fVar80) & uVar36);
    fVar82 = (float)(~uVar37 & 0x7f800000 | (uint)((auVar88._8_4_ - fVar170) * fVar82) & uVar37);
    fVar84 = (float)(~uVar38 & 0x7f800000 | (uint)((auVar88._12_4_ - fVar171) * fVar84) & uVar38);
    fVar160 = fVar153 * fVar86 + fVar161;
    fVar162 = fVar155 * fVar87 + fVar163;
    fVar164 = fVar157 * fVar90 + fVar165;
    fVar166 = fVar159 * fVar91 + fVar167;
    uVar35 = -(uint)(0.0 < fVar160 && fVar160 < (float)local_2d8._0_4_) & auVar56._0_4_;
    uVar36 = -(uint)(0.0 < fVar162 && fVar162 < (float)local_2d8._4_4_) & auVar56._4_4_;
    uVar37 = -(uint)(0.0 < fVar164 && fVar164 < fStack_2d0) & auVar56._8_4_;
    uVar38 = -(uint)(0.0 < fVar166 && fVar166 < fStack_2cc) & auVar56._12_4_;
    auVar137._0_4_ = (uint)fVar86 & uVar35;
    auVar137._4_4_ = (uint)fVar87 & uVar36;
    auVar137._8_4_ = (uint)fVar90 & uVar37;
    auVar137._12_4_ = (uint)fVar91 & uVar38;
    auVar111._0_8_ = CONCAT44(~uVar36,~uVar35) & 0x7f8000007f800000;
    auVar111._8_4_ = ~uVar37 & 0x7f800000;
    auVar111._12_4_ = ~uVar38 & 0x7f800000;
    _local_2f8 = auVar111 | auVar137;
    local_2e8 = fVar153 * fVar78 + fVar161;
    fStack_2e4 = fVar155 * fVar80 + fVar163;
    fStack_2e0 = fVar157 * fVar82 + fVar165;
    fStack_2dc = fVar159 * fVar84 + fVar167;
    auVar64._4_4_ = -(uint)(0.0 < fStack_2e4);
    auVar64._0_4_ = -(uint)(0.0 < local_2e8);
    auVar64._8_4_ = -(uint)(0.0 < fStack_2e0);
    auVar64._12_4_ = -(uint)(0.0 < fStack_2dc);
    uVar35 = -(uint)(local_2e8 < (float)local_2d8._0_4_ && 0.0 < local_2e8) & auVar56._0_4_;
    uVar36 = -(uint)(fStack_2e4 < (float)local_2d8._4_4_ && 0.0 < fStack_2e4) & auVar56._4_4_;
    uVar37 = -(uint)(fStack_2e0 < fStack_2d0 && 0.0 < fStack_2e0) & auVar56._8_4_;
    uVar38 = -(uint)(fStack_2dc < fStack_2cc && 0.0 < fStack_2dc) & auVar56._12_4_;
    auVar42._0_4_ = (uint)fVar78 & uVar35;
    auVar42._4_4_ = (uint)fVar80 & uVar36;
    auVar42._8_4_ = (uint)fVar82 & uVar37;
    auVar42._12_4_ = (uint)fVar84 & uVar38;
    auVar148._0_8_ = CONCAT44(~uVar36,~uVar35) & 0xff800000ff800000;
    auVar148._8_4_ = ~uVar37 & 0xff800000;
    auVar148._12_4_ = ~uVar38 & 0xff800000;
    auVar148 = auVar148 | auVar42;
    auVar20._4_4_ = fVar155;
    auVar20._0_4_ = fVar153;
    auVar20._8_4_ = fVar157;
    auVar20._12_4_ = fVar159;
    auVar97 = rcpps(auVar64,auVar20);
    fVar78 = auVar97._0_4_;
    fVar80 = auVar97._4_4_;
    fVar82 = auVar97._8_4_;
    fVar84 = auVar97._12_4_;
    fVar78 = (1.0 - fVar153 * fVar78) * fVar78 + fVar78;
    fVar80 = (1.0 - fVar155 * fVar80) * fVar80 + fVar80;
    fVar82 = (1.0 - fVar157 * fVar82) * fVar82 + fVar82;
    fVar84 = (1.0 - fVar159 * fVar84) * fVar84 + fVar84;
    fVar92 = fVar153 * fVar135 - fVar54 * fVar161;
    fVar93 = fVar155 * fVar138 - fVar54 * fVar163;
    fVar94 = fVar157 * fVar140 - fVar54 * fVar165;
    fVar95 = fVar159 * fVar142 - fVar54 * fVar167;
    fVar86 = fVar153 * fVar152 - fStack_2b0 * fVar161;
    fVar87 = fVar155 * fVar154 - fStack_2b0 * fVar163;
    fVar90 = fVar157 * fVar156 - fStack_2b0 * fVar165;
    fVar91 = fVar159 * fVar158 - fStack_2b0 * fVar167;
    fVar168 = fVar153 * fVar105 - local_1d8 * fVar161;
    fVar169 = fVar155 * fVar113 - local_1d8 * fVar163;
    fVar170 = fVar157 * fVar117 - local_1d8 * fVar165;
    fVar171 = fVar159 * fVar121 - local_1d8 * fVar167;
    uVar35 = -(uint)(fVar106 * fVar106 * fVar107 <=
                    fVar92 * fVar92 + fVar86 * fVar86 + fVar168 * fVar168);
    uVar36 = -(uint)(fVar114 * fVar114 * fVar115 <=
                    fVar93 * fVar93 + fVar87 * fVar87 + fVar169 * fVar169);
    uVar37 = -(uint)(fVar118 * fVar118 * fVar119 <=
                    fVar94 * fVar94 + fVar90 * fVar90 + fVar170 * fVar170);
    uVar38 = -(uint)(fVar122 * fVar122 * fVar123 <=
                    fVar95 * fVar95 + fVar91 * fVar91 + fVar171 * fVar171);
    auVar89._0_4_ =
         (uVar35 & 0x7f800000 | ~uVar35 & (uint)(-fVar161 * fVar78)) &
         ~*(uint *)(mm_lookupmask_ps + lVar24) & auVar56._0_4_;
    auVar89._4_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar163 * fVar80)) &
         ~*(uint *)(mm_lookupmask_ps + lVar24 + 4) & auVar56._4_4_;
    auVar89._8_4_ =
         (uVar37 & 0x7f800000 | ~uVar37 & (uint)(-fVar165 * fVar82)) &
         ~*(uint *)(mm_lookupmask_ps + lVar24 + 8) & auVar56._8_4_;
    auVar89._12_4_ =
         (uVar38 & 0x7f800000 | ~uVar38 & (uint)(-fVar167 * fVar84)) &
         ~*(uint *)(mm_lookupmask_ps + lVar24 + 0xc) & auVar56._12_4_;
    auVar73._0_8_ =
         CONCAT44(~(~*(uint *)(mm_lookupmask_ps + lVar24 + 4) & auVar56._4_4_),
                  ~(~*(uint *)(mm_lookupmask_ps + lVar24) & auVar56._0_4_)) & 0x7f8000007f800000;
    auVar73._8_4_ = ~(~*(uint *)(mm_lookupmask_ps + lVar24 + 8) & auVar56._8_4_) & 0x7f800000;
    auVar73._12_4_ = ~(~*(uint *)(mm_lookupmask_ps + lVar24 + 0xc) & auVar56._12_4_) & 0x7f800000;
    auVar73 = auVar73 | auVar89;
    fVar86 = fVar96 * fVar153 - fVar54 * fVar126;
    fVar87 = fVar101 * fVar155 - fVar54 * fVar130;
    fVar90 = fVar102 * fVar157 - fVar54 * fVar132;
    fVar91 = fVar103 * fVar159 - fVar54 * fVar134;
    fVar103 = fVar144 * fVar153 - fStack_2b0 * fVar126;
    fVar144 = fVar145 * fVar155 - fStack_2b0 * fVar130;
    fVar145 = fVar146 * fVar157 - fStack_2b0 * fVar132;
    fVar146 = fVar39 * fVar159 - fStack_2b0 * fVar134;
    fVar40 = fVar40 * fVar153 - local_1d8 * fVar126;
    fVar48 = fVar48 * fVar155 - local_1d8 * fVar130;
    fVar50 = fVar50 * fVar157 - local_1d8 * fVar132;
    fVar52 = fVar52 * fVar159 - local_1d8 * fVar134;
    fVar39 = *(float *)(ray + k * 4 + 0x30);
    local_388 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar28);
    fStack_384 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar28) >> 0x20);
    fStack_380 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar28 + 8);
    fStack_37c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar28 + 8) >> 0x20);
    uVar35 = -(uint)(fVar72 * fVar72 * fVar107 <=
                    fVar86 * fVar86 + fVar103 * fVar103 + fVar40 * fVar40);
    uVar36 = -(uint)(fVar75 * fVar75 * fVar115 <=
                    fVar87 * fVar87 + fVar144 * fVar144 + fVar48 * fVar48);
    uVar37 = -(uint)(fVar76 * fVar76 * fVar119 <=
                    fVar90 * fVar90 + fVar145 * fVar145 + fVar50 * fVar50);
    uVar38 = -(uint)(fVar77 * fVar77 * fVar123 <=
                    fVar91 * fVar91 + fVar146 * fVar146 + fVar52 * fVar52);
    auVar98._0_4_ =
         (uVar35 & 0x7f800000 | ~uVar35 & (uint)(-fVar126 * fVar78)) &
         ~(uint)local_388 & auVar56._0_4_;
    auVar98._4_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar130 * fVar80)) &
         ~(uint)fStack_384 & auVar56._4_4_;
    auVar98._8_4_ =
         (uVar37 & 0x7f800000 | ~uVar37 & (uint)(-fVar132 * fVar82)) &
         ~(uint)fStack_380 & auVar56._8_4_;
    auVar98._12_4_ =
         (uVar38 & 0x7f800000 | ~uVar38 & (uint)(-fVar134 * fVar84)) &
         ~(uint)fStack_37c & auVar56._12_4_;
    auVar65._0_8_ =
         CONCAT44(~(~(uint)fStack_384 & auVar56._4_4_),~(~(uint)local_388 & auVar56._0_4_)) &
         0x7f8000007f800000;
    auVar65._8_4_ = ~(~(uint)fStack_380 & auVar56._8_4_) & 0x7f800000;
    auVar65._12_4_ = ~(~(uint)fStack_37c & auVar56._12_4_) & 0x7f800000;
    auVar97 = minps(auVar73,auVar65 | auVar98);
    auVar88 = maxps(auVar73,auVar65 | auVar98);
    auVar110 = minps(_local_2f8,auVar97);
    fVar72 = auVar110._0_4_;
    fVar75 = auVar110._4_4_;
    fVar76 = auVar110._8_4_;
    fVar77 = auVar110._12_4_;
    fVar52 = auVar97._0_4_;
    fVar103 = auVar97._4_4_;
    fVar40 = auVar97._8_4_;
    fVar48 = auVar97._12_4_;
    uVar35 = -(uint)(auVar88._0_4_ != INFINITY);
    uVar36 = -(uint)(auVar88._4_4_ != INFINITY);
    uVar37 = -(uint)(auVar88._8_4_ != INFINITY);
    uVar38 = -(uint)(auVar88._12_4_ != INFINITY);
    auVar66._0_4_ =
         (~-(uint)(fVar52 != INFINITY) & 0xff800000 | (uint)fVar52 & -(uint)(fVar52 != INFINITY)) &
         -(uint)(fVar72 != fVar52);
    auVar66._4_4_ =
         (~-(uint)(fVar103 != INFINITY) & 0xff800000 | (uint)fVar103 & -(uint)(fVar103 != INFINITY))
         & -(uint)(fVar75 != fVar103);
    auVar66._8_4_ =
         (~-(uint)(fVar40 != INFINITY) & 0xff800000 | (uint)fVar40 & -(uint)(fVar40 != INFINITY)) &
         -(uint)(fVar76 != fVar40);
    auVar66._12_4_ =
         (~-(uint)(fVar48 != INFINITY) & 0xff800000 | (uint)fVar48 & -(uint)(fVar48 != INFINITY)) &
         -(uint)(fVar77 != fVar48);
    auVar99._0_4_ =
         ~-(uint)(fVar72 != fVar52) & (~uVar35 & 0xff800000 | (uint)auVar88._0_4_ & uVar35);
    auVar99._4_4_ =
         ~-(uint)(fVar75 != fVar103) & (~uVar36 & 0xff800000 | (uint)auVar88._4_4_ & uVar36);
    auVar99._8_4_ =
         ~-(uint)(fVar76 != fVar40) & (~uVar37 & 0xff800000 | (uint)auVar88._8_4_ & uVar37);
    auVar99._12_4_ =
         ~-(uint)(fVar77 != fVar48) & (~uVar38 & 0xff800000 | (uint)auVar88._12_4_ & uVar38);
    _local_58 = maxps(auVar148,auVar99 | auVar66);
    fVar52 = *(float *)(ray + k * 4 + 0x80);
    local_1f8 = -(uint)((fVar39 <= fVar55 + fVar72 && fVar55 + fVar72 <= fVar52) &&
                       fVar72 != INFINITY);
    uStack_1f4 = -(uint)((fVar39 <= fVar62 + fVar75 && fVar62 + fVar75 <= fVar52) &&
                        fVar75 != INFINITY);
    uStack_1f0 = -(uint)((fVar39 <= fStack_2c0 + fVar76 && fStack_2c0 + fVar76 <= fVar52) &&
                        fVar76 != INFINITY);
    uStack_1ec = -(uint)((fVar39 <= fStack_2bc + fVar77 && fStack_2bc + fVar77 <= fVar52) &&
                        fVar77 != INFINITY);
    fVar103 = local_58._0_4_;
    local_2a8 = fVar55 + fVar103;
    fVar40 = local_58._4_4_;
    fStack_2a4 = fVar62 + fVar40;
    fVar48 = local_58._8_4_;
    fStack_2a0 = fStack_2c0 + fVar48;
    fVar50 = local_58._12_4_;
    fStack_29c = fStack_2bc + fVar50;
    uVar36 = local_1f8 & auVar56._0_4_;
    uVar37 = uStack_1f4 & auVar56._4_4_;
    auVar43._4_4_ = uVar37;
    auVar43._0_4_ = uVar36;
    uVar38 = uStack_1f0 & auVar56._8_4_;
    uVar104 = uStack_1ec & auVar56._12_4_;
    local_48._0_4_ =
         -(uint)(fVar103 != -INFINITY) & auVar56._0_4_ &
         -(uint)(local_2a8 <= fVar52 && fVar39 <= local_2a8);
    local_48._4_4_ =
         -(uint)(fVar40 != -INFINITY) & auVar56._4_4_ &
         -(uint)(fStack_2a4 <= fVar52 && fVar39 <= fStack_2a4);
    local_48._8_4_ =
         -(uint)(fVar48 != -INFINITY) & auVar56._8_4_ &
         -(uint)(fStack_2a0 <= fVar52 && fVar39 <= fStack_2a0);
    local_48._12_4_ =
         -(uint)(fVar50 != -INFINITY) & auVar56._12_4_ &
         -(uint)(fStack_29c <= fVar52 && fVar39 <= fStack_29c);
    auVar43._8_4_ = uVar38;
    auVar43._12_4_ = uVar104;
    uVar35 = movmskps((int)lVar24,auVar43 | local_48);
    if (uVar35 != 0) {
      fVar78 = (float)((uint)fVar72 & uVar36 | ~uVar36 & (uint)fVar103);
      fVar75 = (float)((uint)fVar75 & uVar37 | ~uVar37 & (uint)fVar40);
      fVar76 = (float)((uint)fVar76 & uVar38 | ~uVar38 & (uint)fVar48);
      fVar77 = (float)((uint)fVar77 & uVar104 | ~uVar104 & (uint)fVar50);
      auVar44._0_4_ = (uint)fVar160 & uVar36;
      auVar44._4_4_ = (uint)fVar162 & uVar37;
      auVar44._8_4_ = (uint)fVar164 & uVar38;
      auVar44._12_4_ = (uint)fVar166 & uVar104;
      auVar100._0_4_ = ~uVar36 & (uint)local_2e8;
      auVar100._4_4_ = ~uVar37 & (uint)fStack_2e4;
      auVar100._8_4_ = ~uVar38 & (uint)fStack_2e0;
      auVar100._12_4_ = ~uVar104 & (uint)fStack_2dc;
      auVar100 = auVar100 | auVar44;
      auVar97 = rcpps(auVar44,_local_2d8);
      local_208 = auVar97._0_4_;
      fStack_204 = auVar97._4_4_;
      fStack_200 = auVar97._8_4_;
      fStack_1fc = auVar97._12_4_;
      local_208 = (1.0 - (float)local_2d8._0_4_ * local_208) * local_208 + local_208;
      fStack_204 = (1.0 - (float)local_2d8._4_4_ * fStack_204) * fStack_204 + fStack_204;
      fStack_200 = (1.0 - fStack_2d0 * fStack_200) * fStack_200 + fStack_200;
      fStack_1fc = (1.0 - fStack_2cc * fStack_1fc) * fStack_1fc + fStack_1fc;
      fVar106 = fVar106 * fVar63 * (float)local_2d8._0_4_;
      fVar114 = fVar114 * fVar69 * (float)local_2d8._4_4_;
      fVar118 = fVar118 * fVar70 * fStack_2d0;
      fVar122 = fVar122 * fVar71 * fStack_2cc;
      local_218 = fVar125 * fVar106;
      fStack_214 = fVar129 * fVar114;
      fStack_210 = fVar131 * fVar118;
      fStack_20c = fVar133 * fVar122;
      fVar50 = fVar106 * fVar79;
      fVar63 = fVar114 * fVar81;
      fVar69 = fVar118 * fVar83;
      fVar70 = fVar122 * fVar85;
      local_1e8 = fVar136 * fVar79;
      fStack_1e4 = fVar139 * fVar81;
      fStack_1e0 = fVar141 * fVar83;
      fStack_1dc = fVar143 * fVar85;
      local_388 = auVar148._0_4_;
      fStack_384 = auVar148._4_4_;
      fStack_380 = auVar148._8_4_;
      fStack_37c = auVar148._12_4_;
      uVar41 = -(uint)(fVar78 == local_388 || fVar78 == (float)local_2f8._0_4_) & auVar56._0_4_;
      uVar49 = -(uint)(fVar75 == fStack_384 || fVar75 == (float)local_2f8._4_4_) & auVar56._4_4_;
      uVar51 = -(uint)(fVar76 == fStack_380 || fVar76 == fStack_2f0) & auVar56._8_4_;
      uVar53 = -(uint)(fVar77 == fStack_37c || fVar77 == fStack_2ec) & auVar56._12_4_;
      uVar108 = -(uint)(fVar78 == auVar73._0_4_) & auVar56._0_4_;
      uVar116 = -(uint)(fVar75 == auVar73._4_4_) & auVar56._4_4_;
      uVar120 = -(uint)(fVar76 == auVar73._8_4_) & auVar56._8_4_;
      uVar124 = -(uint)(fVar77 == auVar73._12_4_) & auVar56._12_4_;
      local_68 = fVar147 * fVar106;
      fStack_64 = fVar149 * fVar114;
      fStack_60 = fVar150 * fVar118;
      fStack_5c = fVar151 * fVar122;
      local_88 = fVar147 * fVar136;
      fStack_84 = fVar149 * fVar139;
      fStack_80 = fVar150 * fVar141;
      fStack_7c = fVar151 * fVar143;
      fVar39 = auVar100._0_4_;
      fVar103 = auVar100._4_4_;
      fVar40 = auVar100._8_4_;
      fVar48 = auVar100._12_4_;
      local_78 = fVar125 * fVar136;
      fStack_74 = fVar129 * fVar139;
      fStack_70 = fVar131 * fVar141;
      fStack_6c = fVar133 * fVar143;
      local_98 = -fVar147;
      fStack_94 = -fVar149;
      fStack_90 = -fVar150;
      fStack_8c = -fVar151;
      local_a8 = -fVar125;
      fStack_a4 = -fVar129;
      fStack_a0 = -fVar131;
      fStack_9c = -fVar133;
      fVar71 = -fVar83;
      fVar72 = -fVar85;
      local_378 = CONCAT44(fVar81,fVar79) ^ 0x8000000080000000;
      auVar112._0_4_ = ~uVar41 & ((uint)-fVar147 & uVar108 | ~uVar108 & (uint)fVar147);
      auVar112._4_4_ = ~uVar49 & ((uint)-fVar149 & uVar116 | ~uVar116 & (uint)fVar149);
      auVar112._8_4_ = ~uVar51 & ((uint)-fVar150 & uVar120 | ~uVar120 & (uint)fVar150);
      auVar112._12_4_ = ~uVar53 & ((uint)-fVar151 & uVar124 | ~uVar124 & (uint)fVar151);
      auVar67._0_4_ =
           (uint)(((fVar54 * fVar78 + fVar135) * local_158 + fVar147 * fVar106) -
                 fVar147 * fVar136 * fVar39) & uVar41;
      auVar67._4_4_ =
           (uint)(((fVar54 * fVar75 + fVar138) * fStack_154 + fVar149 * fVar114) -
                 fVar149 * fVar139 * fVar103) & uVar49;
      auVar67._8_4_ =
           (uint)(((fVar54 * fVar76 + fVar140) * fStack_150 + fVar150 * fVar118) -
                 fVar150 * fVar141 * fVar40) & uVar51;
      auVar67._12_4_ =
           (uint)(((fVar54 * fVar77 + fVar142) * fStack_14c + fVar151 * fVar122) -
                 fVar151 * fVar143 * fVar48) & uVar53;
      uVar36 = ~uVar108 & 0x3f800000;
      uVar37 = ~uVar116 & 0x3f800000;
      uVar38 = ~uVar120 & 0x3f800000;
      uVar104 = ~uVar124 & 0x3f800000;
      local_1a8._0_4_ = fVar55 + fVar78;
      local_1a8._4_4_ = fVar62 + fVar75;
      fStack_1a0 = fStack_2c0 + fVar76;
      fStack_19c = fStack_2bc + fVar77;
      local_1c8[0] = ~uVar41 & uVar36 | (uint)(fVar39 * local_208) & uVar41;
      local_1c8[1] = ~uVar49 & uVar37 | (uint)(fVar103 * fStack_204) & uVar49;
      local_1c8[2] = ~uVar51 & uVar38 | (uint)(fVar40 * fStack_200) & uVar51;
      local_1c8[3] = ~uVar53 & uVar104 | (uint)(fVar48 * fStack_1fc) & uVar53;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_198 = auVar67 | auVar112;
      local_188._4_4_ =
           (uint)(((fStack_2b0 * fVar75 + fVar154) * fStack_154 + fStack_214) -
                 fVar129 * fVar139 * fVar103) & uVar49 |
           ~uVar49 & ((uint)-fVar129 & uVar116 | ~uVar116 & (uint)fVar129);
      local_188._0_4_ =
           (uint)(((fStack_2b0 * fVar78 + fVar152) * local_158 + local_218) -
                 fVar125 * fVar136 * fVar39) & uVar41 |
           ~uVar41 & ((uint)-fVar125 & uVar108 | ~uVar108 & (uint)fVar125);
      local_188._8_4_ =
           (uint)(((fStack_2b0 * fVar76 + fVar156) * fStack_150 + fStack_210) -
                 fVar131 * fVar141 * fVar40) & uVar51 |
           ~uVar51 & ((uint)-fVar131 & uVar120 | ~uVar120 & (uint)fVar131);
      local_188._12_4_ =
           (uint)(((fStack_2b0 * fVar77 + fVar158) * fStack_14c + fStack_20c) -
                 fVar133 * fVar143 * fVar48) & uVar53 |
           ~uVar53 & ((uint)-fVar133 & uVar124 | ~uVar124 & (uint)fVar133);
      local_178._4_4_ =
           (uint)(((local_1d8 * fVar75 + fVar113) * fStack_154 + fVar63) - fStack_1e4 * fVar103) &
           uVar49 | ~uVar49 & ((uint)-fVar81 & uVar116 | ~uVar116 & (uint)fVar81);
      local_178._0_4_ =
           (uint)(((local_1d8 * fVar78 + fVar105) * local_158 + fVar50) - local_1e8 * fVar39) &
           uVar41 | ~uVar41 & ((uint)-fVar79 & uVar108 | ~uVar108 & (uint)fVar79);
      local_178._8_4_ =
           (uint)(((local_1d8 * fVar76 + fVar117) * fStack_150 + fVar69) - fStack_1e0 * fVar40) &
           uVar51 | ~uVar51 & ((uint)fVar71 & uVar120 | ~uVar120 & (uint)fVar83);
      local_178._12_4_ =
           (uint)(((local_1d8 * fVar77 + fVar121) * fStack_14c + fVar70) - fStack_1dc * fVar48) &
           uVar53 | ~uVar53 & ((uint)fVar72 & uVar124 | ~uVar124 & (uint)fVar85);
      uVar34 = (ulong)(uVar35 & 0xff);
      lVar31 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      pSVar32 = local_300;
      _local_2d8 = auVar73;
      fStack_2ac = fStack_2b0;
      local_298 = fVar152;
      fStack_294 = fVar154;
      fStack_290 = fVar156;
      fStack_28c = fVar158;
      local_288 = fVar135;
      fStack_284 = fVar138;
      fStack_280 = fVar140;
      fStack_27c = fVar142;
      local_278 = fVar79;
      fStack_274 = fVar81;
      fStack_270 = fVar83;
      fStack_26c = fVar85;
      local_268 = fVar125;
      fStack_264 = fVar129;
      fStack_260 = fVar131;
      fStack_25c = fVar133;
      local_228 = fVar147;
      fStack_224 = fVar149;
      fStack_220 = fVar150;
      fStack_21c = fVar151;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      do {
        uVar19 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_d8 = local_148[uVar19];
        pGVar18 = (pSVar32->geometries).items[local_d8].ptr;
        pRVar25 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
        if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          pRVar25 = context->args;
          if ((pRVar25->filter == (RTCFilterFunctionN)0x0) &&
             (bVar29 = true, pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00acba44;
          local_108 = local_1c8[uVar19];
          uVar17 = *(undefined4 *)((long)&local_1b8 + uVar19 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar19 * 4);
          local_258.context = context->user;
          local_e8 = (line->primIDs).field_0.i[uVar19];
          local_f8._4_4_ = uVar17;
          local_f8._0_4_ = uVar17;
          local_f8._8_4_ = uVar17;
          local_f8._12_4_ = uVar17;
          local_138 = *(undefined4 *)(local_198 + uVar19 * 4);
          local_128 = *(undefined4 *)(local_188 + uVar19 * 4);
          local_118 = *(undefined4 *)(local_178 + uVar19 * 4);
          uStack_134 = local_138;
          uStack_130 = local_138;
          uStack_12c = local_138;
          uStack_124 = local_128;
          uStack_120 = local_128;
          uStack_11c = local_128;
          uStack_114 = local_118;
          uStack_110 = local_118;
          uStack_10c = local_118;
          uStack_104 = local_108;
          uStack_100 = local_108;
          uStack_fc = local_108;
          uStack_e4 = local_e8;
          uStack_e0 = local_e8;
          uStack_dc = local_e8;
          uStack_d4 = local_d8;
          uStack_d0 = local_d8;
          uStack_cc = local_d8;
          uStack_c4 = (local_258.context)->instID[0];
          local_c8 = uStack_c4;
          uStack_c0 = uStack_c4;
          uStack_bc = uStack_c4;
          uStack_b4 = (local_258.context)->instPrimID[0];
          local_b8 = uStack_b4;
          uStack_b0 = uStack_b4;
          uStack_ac = uStack_b4;
          local_318 = *(int *)(mm_lookupmask_ps + lVar31);
          iStack_314 = *(int *)(mm_lookupmask_ps + lVar31 + 4);
          iStack_310 = *(int *)(mm_lookupmask_ps + lVar31 + 8);
          iStack_30c = *(int *)(mm_lookupmask_ps + lVar31 + 0xc);
          local_258.valid = &local_318;
          local_258.geometryUserPtr = pGVar18->userPtr;
          local_258.hit = (RTCHitN *)&local_138;
          local_258.N = 4;
          p_Var26 = pGVar18->occlusionFilterN;
          local_168 = uVar36;
          uStack_164 = uVar37;
          uStack_160 = uVar38;
          uStack_15c = uVar104;
          local_258.ray = (RTCRayN *)ray;
          if (p_Var26 != (RTCFilterFunctionN)0x0) {
            local_2c8 = ray;
            p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&local_258);
            pSVar32 = local_300;
            ray = local_2c8;
            fVar152 = local_298;
            fVar154 = fStack_294;
            fVar156 = fStack_290;
            fVar158 = fStack_28c;
            fVar147 = local_228;
            fVar149 = fStack_224;
            fVar150 = fStack_220;
            fVar151 = fStack_21c;
            fVar125 = local_268;
            fVar129 = fStack_264;
            fVar131 = fStack_260;
            fVar133 = fStack_25c;
            fVar79 = local_278;
            fVar81 = fStack_274;
            fVar83 = fStack_270;
            fVar85 = fStack_26c;
            fVar135 = local_288;
            fVar138 = fStack_284;
            fVar140 = fStack_280;
            fVar142 = fStack_27c;
          }
          auVar57._0_4_ = -(uint)(local_318 == 0);
          auVar57._4_4_ = -(uint)(iStack_314 == 0);
          auVar57._8_4_ = -(uint)(iStack_310 == 0);
          auVar57._12_4_ = -(uint)(iStack_30c == 0);
          uVar35 = movmskps((int)p_Var26,auVar57);
          pRVar27 = (RTCRayN *)(ulong)(uVar35 ^ 0xf);
          if ((uVar35 ^ 0xf) == 0) {
            auVar57 = auVar57 ^ _DAT_01f7ae20;
          }
          else {
            p_Var26 = context->args->filter;
            if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var26)(&local_258);
              pSVar32 = local_300;
              fVar152 = local_298;
              fVar154 = fStack_294;
              fVar156 = fStack_290;
              fVar158 = fStack_28c;
              fVar147 = local_228;
              fVar149 = fStack_224;
              fVar150 = fStack_220;
              fVar151 = fStack_21c;
              fVar125 = local_268;
              fVar129 = fStack_264;
              fVar131 = fStack_260;
              fVar133 = fStack_25c;
              fVar79 = local_278;
              fVar81 = fStack_274;
              fVar83 = fStack_270;
              fVar85 = fStack_26c;
              fVar135 = local_288;
              fVar138 = fStack_284;
              fVar140 = fStack_280;
              fVar142 = fStack_27c;
            }
            auVar45._0_4_ = -(uint)(local_318 == 0);
            auVar45._4_4_ = -(uint)(iStack_314 == 0);
            auVar45._8_4_ = -(uint)(iStack_310 == 0);
            auVar45._12_4_ = -(uint)(iStack_30c == 0);
            auVar57 = auVar45 ^ _DAT_01f7ae20;
            *(undefined1 (*) [16])(local_258.ray + 0x80) =
                 ~auVar45 & _DAT_01f7aa00 | *(undefined1 (*) [16])(local_258.ray + 0x80) & auVar45;
            pRVar27 = local_258.ray;
          }
          auVar58._0_4_ = auVar57._0_4_ << 0x1f;
          auVar58._4_4_ = auVar57._4_4_ << 0x1f;
          auVar58._8_4_ = auVar57._8_4_ << 0x1f;
          auVar58._12_4_ = auVar57._12_4_ << 0x1f;
          uVar35 = movmskps((int)pRVar27,auVar58);
          pRVar25 = (RTCIntersectArguments *)(ulong)uVar35;
          uVar36 = local_168;
          uVar37 = uStack_164;
          uVar38 = uStack_160;
          uVar104 = uStack_15c;
          if (uVar35 != 0) {
            fVar52 = *(float *)(ray + k * 4 + 0x80);
            bVar29 = true;
            goto LAB_00acba1a;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar52;
        }
        uVar34 = uVar34 ^ 1L << (uVar19 & 0x3f);
      } while (uVar34 != 0);
      bVar29 = false;
LAB_00acba1a:
LAB_00acba44:
      auVar46._0_4_ = local_1f8 & local_48._0_4_ & -(uint)(local_2a8 <= fVar52);
      auVar46._4_4_ = uStack_1f4 & local_48._4_4_ & -(uint)(fStack_2a4 <= fVar52);
      auVar46._8_4_ = uStack_1f0 & local_48._8_4_ & -(uint)(fStack_2a0 <= fVar52);
      auVar46._12_4_ = uStack_1ec & local_48._12_4_ & -(uint)(fStack_29c <= fVar52);
      uVar35 = movmskps((int)pRVar25,auVar46);
      if (uVar35 == 0) {
        return bVar29;
      }
      uVar108 = -(uint)((float)local_2f8._0_4_ != (float)local_58._0_4_ &&
                       local_388 != (float)local_58._0_4_);
      uVar116 = -(uint)((float)local_2f8._4_4_ != (float)local_58._4_4_ &&
                       fStack_384 != (float)local_58._4_4_);
      uVar120 = -(uint)(fStack_2f0 != fStack_50 && fStack_380 != fStack_50);
      uVar124 = -(uint)(fStack_2ec != fStack_4c && fStack_37c != fStack_4c);
      uVar41 = -(uint)((float)local_2d8._0_4_ != (float)local_58._0_4_);
      uVar49 = -(uint)((float)local_2d8._4_4_ != (float)local_58._4_4_);
      uVar51 = -(uint)(fStack_2d0 != fStack_50);
      uVar53 = -(uint)(fStack_2cc != fStack_4c);
      auVar59._0_4_ =
           ~uVar108 &
           (uint)((local_218 + (fVar152 + (float)local_2b8 * (float)local_58._0_4_) * local_158) -
                 local_78 * local_2e8);
      auVar59._4_4_ =
           ~uVar116 &
           (uint)((fStack_214 + (fVar154 + local_2b8._4_4_ * (float)local_58._4_4_) * fStack_154) -
                 fStack_74 * fStack_2e4);
      auVar59._8_4_ =
           ~uVar120 &
           (uint)((fStack_210 + (fVar156 + fStack_2b0 * fStack_50) * fStack_150) -
                 fStack_70 * fStack_2e0);
      auVar59._12_4_ =
           ~uVar124 &
           (uint)((fStack_20c + (fVar158 + fStack_2ac * fStack_4c) * fStack_14c) -
                 fStack_6c * fStack_2dc);
      auVar127._0_4_ = ((uint)fVar125 & uVar41 | ~uVar41 & (uint)local_a8) & uVar108;
      auVar127._4_4_ = ((uint)fVar129 & uVar49 | ~uVar49 & (uint)fStack_a4) & uVar116;
      auVar127._8_4_ = ((uint)fVar131 & uVar51 | ~uVar51 & (uint)fStack_a0) & uVar120;
      auVar127._12_4_ = ((uint)fVar133 & uVar53 | ~uVar53 & (uint)fStack_9c) & uVar124;
      auVar68._0_4_ =
           ~uVar108 &
           (uint)((fVar50 + (fVar105 + local_1d8 * (float)local_58._0_4_) * local_158) -
                 local_1e8 * local_2e8);
      auVar68._4_4_ =
           ~uVar116 &
           (uint)((fVar63 + (fVar113 + fStack_1d4 * (float)local_58._4_4_) * fStack_154) -
                 fStack_1e4 * fStack_2e4);
      auVar68._8_4_ =
           ~uVar120 &
           (uint)((fVar69 + (fVar117 + fStack_1d0 * fStack_50) * fStack_150) -
                 fStack_1e0 * fStack_2e0);
      auVar68._12_4_ =
           ~uVar124 &
           (uint)((fVar70 + (fVar121 + fStack_1cc * fStack_4c) * fStack_14c) -
                 fStack_1dc * fStack_2dc);
      auVar74._0_4_ = (~uVar41 & (uint)local_378 | (uint)fVar79 & uVar41) & uVar108;
      auVar74._4_4_ = (~uVar49 & local_378._4_4_ | (uint)fVar81 & uVar49) & uVar116;
      auVar74._8_4_ = (~uVar51 & (uint)fVar71 | (uint)fVar83 & uVar51) & uVar120;
      auVar74._12_4_ = (~uVar53 & (uint)fVar72 | (uint)fVar85 & uVar53) & uVar124;
      local_1c8[0] = ~uVar108 & (uint)(local_208 * local_2e8) | uVar36 & uVar108;
      local_1c8[1] = ~uVar116 & (uint)(fStack_204 * fStack_2e4) | uVar37 & uVar116;
      local_1c8[2] = ~uVar120 & (uint)(fStack_200 * fStack_2e0) | uVar38 & uVar120;
      local_1c8[3] = ~uVar124 & (uint)(fStack_1fc * fStack_2dc) | uVar104 & uVar124;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8._4_4_ = fStack_2a4;
      local_1a8._0_4_ = local_2a8;
      fStack_1a0 = fStack_2a0;
      fStack_19c = fStack_29c;
      local_198._4_4_ =
           ~uVar116 &
           (uint)((fStack_64 + (fVar138 + fVar54 * (float)local_58._4_4_) * fStack_154) -
                 fStack_84 * fStack_2e4) |
           ((uint)fVar149 & uVar49 | ~uVar49 & (uint)fStack_94) & uVar116;
      local_198._0_4_ =
           ~uVar108 &
           (uint)((local_68 + (fVar135 + fVar54 * (float)local_58._0_4_) * local_158) -
                 local_88 * local_2e8) |
           ((uint)fVar147 & uVar41 | ~uVar41 & (uint)local_98) & uVar108;
      local_198._8_4_ =
           ~uVar120 &
           (uint)((fStack_60 + (fVar140 + fVar54 * fStack_50) * fStack_150) - fStack_80 * fStack_2e0
                 ) | ((uint)fVar150 & uVar51 | ~uVar51 & (uint)fStack_90) & uVar120;
      local_198._12_4_ =
           ~uVar124 &
           (uint)((fStack_5c + (fVar142 + fVar54 * fStack_4c) * fStack_14c) - fStack_7c * fStack_2dc
                 ) | ((uint)fVar151 & uVar53 | ~uVar53 & (uint)fStack_8c) & uVar124;
      local_188 = auVar59 | auVar127;
      local_178 = auVar68 | auVar74;
      pSVar32 = context->scene;
      uVar34 = (ulong)(uVar35 & 0xff);
      auVar128._8_4_ = 0xffffffff;
      auVar128._0_8_ = 0xffffffffffffffff;
      auVar128._12_4_ = 0xffffffff;
      do {
        uVar19 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_d8 = local_148[uVar19];
        pGVar18 = (pSVar32->geometries).items[local_d8].ptr;
        if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar23 = 1, pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00acbe56;
          local_108 = local_1c8[uVar19];
          uVar17 = *(undefined4 *)((long)&local_1b8 + uVar19 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar19 * 4);
          local_258.context = context->user;
          local_e8 = (line->primIDs).field_0.i[uVar19];
          local_f8._4_4_ = uVar17;
          local_f8._0_4_ = uVar17;
          local_f8._8_4_ = uVar17;
          local_f8._12_4_ = uVar17;
          local_138 = *(undefined4 *)(local_198 + uVar19 * 4);
          local_128 = *(undefined4 *)(local_188 + uVar19 * 4);
          local_118 = *(undefined4 *)(local_178 + uVar19 * 4);
          uStack_134 = local_138;
          uStack_130 = local_138;
          uStack_12c = local_138;
          uStack_124 = local_128;
          uStack_120 = local_128;
          uStack_11c = local_128;
          uStack_114 = local_118;
          uStack_110 = local_118;
          uStack_10c = local_118;
          uStack_104 = local_108;
          uStack_100 = local_108;
          uStack_fc = local_108;
          uStack_e4 = local_e8;
          uStack_e0 = local_e8;
          uStack_dc = local_e8;
          uStack_d4 = local_d8;
          uStack_d0 = local_d8;
          uStack_cc = local_d8;
          uStack_c4 = (local_258.context)->instID[0];
          local_c8 = uStack_c4;
          uStack_c0 = uStack_c4;
          uStack_bc = uStack_c4;
          uStack_b4 = (local_258.context)->instPrimID[0];
          local_b8 = uStack_b4;
          uStack_b0 = uStack_b4;
          uStack_ac = uStack_b4;
          local_318 = *(int *)(mm_lookupmask_ps + lVar31);
          iStack_314 = *(int *)(mm_lookupmask_ps + lVar31 + 4);
          iStack_310 = *(int *)(mm_lookupmask_ps + lVar31 + 8);
          iStack_30c = *(int *)(mm_lookupmask_ps + lVar31 + 0xc);
          local_258.valid = &local_318;
          local_258.geometryUserPtr = pGVar18->userPtr;
          local_258.hit = (RTCHitN *)&local_138;
          local_258.N = 4;
          p_Var26 = pGVar18->occlusionFilterN;
          local_258.ray = (RTCRayN *)ray;
          if (p_Var26 != (RTCFilterFunctionN)0x0) {
            local_2c8 = ray;
            p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&local_258);
            auVar128._8_4_ = 0xffffffff;
            auVar128._0_8_ = 0xffffffffffffffff;
            auVar128._12_4_ = 0xffffffff;
            ray = local_2c8;
          }
          auVar60._0_4_ = -(uint)(local_318 == 0);
          auVar60._4_4_ = -(uint)(iStack_314 == 0);
          auVar60._8_4_ = -(uint)(iStack_310 == 0);
          auVar60._12_4_ = -(uint)(iStack_30c == 0);
          uVar35 = movmskps((int)p_Var26,auVar60);
          pRVar27 = (RTCRayN *)(ulong)(uVar35 ^ 0xf);
          if ((uVar35 ^ 0xf) == 0) {
            auVar60 = auVar60 ^ auVar128;
          }
          else {
            p_Var26 = context->args->filter;
            if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var26)(&local_258);
              auVar128._8_4_ = 0xffffffff;
              auVar128._0_8_ = 0xffffffffffffffff;
              auVar128._12_4_ = 0xffffffff;
            }
            auVar47._0_4_ = -(uint)(local_318 == 0);
            auVar47._4_4_ = -(uint)(iStack_314 == 0);
            auVar47._8_4_ = -(uint)(iStack_310 == 0);
            auVar47._12_4_ = -(uint)(iStack_30c == 0);
            auVar60 = auVar47 ^ auVar128;
            *(undefined1 (*) [16])(local_258.ray + 0x80) =
                 ~auVar47 & _DAT_01f7aa00 | *(undefined1 (*) [16])(local_258.ray + 0x80) & auVar47;
            pRVar27 = local_258.ray;
          }
          auVar61._0_4_ = auVar60._0_4_ << 0x1f;
          auVar61._4_4_ = auVar60._4_4_ << 0x1f;
          auVar61._8_4_ = auVar60._8_4_ << 0x1f;
          auVar61._12_4_ = auVar60._12_4_ << 0x1f;
          iVar30 = movmskps((int)pRVar27,auVar61);
          if (iVar30 != 0) {
            bVar23 = 1;
            goto LAB_00acbe56;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar52;
        }
        uVar34 = uVar34 ^ 1L << (uVar19 & 0x3f);
        if (uVar34 == 0) {
          bVar23 = 0;
LAB_00acbe56:
          return (bool)(bVar29 | bVar23);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }